

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

QCommandLineOption __thiscall QCommandLineParser::addHelpOption(QCommandLineParser *this)

{
  QCommandLineParser *in_RSI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QCommandLineOption optHelpAll;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->d = (QCommandLineParserPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = 0;
  local_50.d = (Data *)0x0;
  local_38.d = (Data *)0x0;
  local_38.ptr = (QString *)0x0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_50.ptr = L"h";
  local_68.size = 0;
  local_50.size = 1;
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_38,(QString *)&local_50);
  local_88.d = (Data *)0x0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_88.ptr = L"help";
  local_a8.size = 0;
  local_88.size = 4;
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_38,(QString *)&local_88);
  tr((QString *)&optHelpAll,"Displays help on commandline options.",(char *)0x0,-1);
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_d8.size = 0;
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char16_t *)0x0;
  local_f8.size = 0;
  QCommandLineOption::QCommandLineOption
            ((QCommandLineOption *)this,(QStringList *)&local_38,(QString *)&optHelpAll,
             (QString *)&local_d8,(QString *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&optHelpAll);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  addOption(in_RSI,(QCommandLineOption *)this);
  optHelpAll.d.d.ptr = (QSharedDataPointer<QCommandLineOptionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)0x0;
  local_50.d = (Data *)0x0;
  local_50.ptr = (char16_t *)0x0;
  local_38.ptr = (QString *)0x51f708;
  local_50.size = 0;
  local_38.size = 8;
  tr((QString *)&local_68,"Displays help, including generic Qt options.",(char *)0x0,-1);
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  QCommandLineOption::QCommandLineOption
            (&optHelpAll,(QString *)&local_38,(QString *)&local_68,(QString *)&local_88,
             (QString *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  addOption(in_RSI,&optHelpAll);
  in_RSI->d->builtinHelpOption = true;
  QCommandLineOption::~QCommandLineOption(&optHelpAll);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QSharedDataPointer<QCommandLineOptionPrivate>)
           (QSharedDataPointer<QCommandLineOptionPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QCommandLineOption QCommandLineParser::addHelpOption()
{
    QCommandLineOption opt(QStringList()
#ifdef Q_OS_WIN
                << QStringLiteral("?")
#endif
                << QStringLiteral("h")
                << QStringLiteral("help"), tr("Displays help on commandline options."));
    addOption(opt);
    QCommandLineOption optHelpAll(QStringLiteral("help-all"),
                                  tr("Displays help, including generic Qt options."));
    addOption(optHelpAll);
    d->builtinHelpOption = true;
    return opt;
}